

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockAddr.cpp
# Opt level: O3

SockAddr * AGSSock::SockAddr_CreateIP(char *ip,ags_t port)

{
  SockAddr *pSVar1;
  
  pSVar1 = (SockAddr *)operator_new(0x80);
  (**(code **)(*AGSSockAPI::engine + 0x220))(AGSSockAPI::engine,pSVar1,&agsSockAddr);
  (pSVar1->super_sockaddr_storage).ss_family = 0;
  (pSVar1->super_sockaddr_storage).__ss_padding[0] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[1] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[2] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[3] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[4] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[5] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[6] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[7] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[8] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[9] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[10] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0xb] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0xc] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0xd] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0xe] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0xf] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x10] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x11] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x12] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x13] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x14] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x15] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x16] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x17] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x18] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x19] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x1a] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x1b] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x1c] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x1d] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x1e] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x1f] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x20] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x21] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x22] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x23] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x24] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x25] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x26] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x27] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x28] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x29] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x2a] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x2b] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x2c] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x2d] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x2e] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x2f] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x30] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x31] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x32] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x33] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x34] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x35] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x36] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x37] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x38] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x39] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x3a] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x3b] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x3c] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x3d] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x3e] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x3f] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x40] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x41] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x42] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x43] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x44] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x45] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x46] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x47] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x48] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x49] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x4a] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x4b] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x4c] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x4d] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x4e] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x4f] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x50] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x51] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x52] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x53] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x54] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x55] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x56] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x57] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x58] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x59] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x5a] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x5b] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x5c] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x5d] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x5e] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x5f] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x60] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x61] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x62] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[99] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[100] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x65] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x66] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x67] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x68] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x69] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x6a] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x6b] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x6c] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x6d] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x6e] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x6f] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x70] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x71] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x72] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x73] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x74] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_padding[0x75] = '\0';
  (pSVar1->super_sockaddr_storage).__ss_align = 0;
  (pSVar1->super_sockaddr_storage).ss_family = 2;
  inet_pton(2,ip,(pSVar1->super_sockaddr_storage).__ss_padding + 2);
  if (((pSVar1->super_sockaddr_storage).ss_family | 8) == 10) {
    *(ushort *)(pSVar1->super_sockaddr_storage).__ss_padding = (ushort)port << 8 | (ushort)port >> 8
    ;
  }
  return pSVar1;
}

Assistant:

SockAddr *SockAddr_CreateIP(const char *ip, ags_t port)
{
	SockAddr *addr = SockAddr_Create(AF_INET);
	SockAddr_set_IP(addr, ip);
	SockAddr_set_Port(addr, port);
	return addr;
}